

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O2

void leccalc::outputaggreports
               (aggreports *agg,set<int,_std::less<int>,_std::allocator<int>_> *summaryids,
               vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
               *out_loss,int samplesize,vector<int,_std::allocator<int>_> *fileIDs_occ,
               vector<int,_std::allocator<int>_> *fileIDs_agg,bool hasEPT)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  allocator_type local_41;
  _Vector_base<int,_std::allocator<int>_> local_40;
  int local_28 [2];
  
  aggreports::SetInputData(agg,summaryids,out_loss);
  if (hasEPT) {
    aggreports::OutputMeanDamageRatio(agg,1,2,0x104582,(vector<int,_std::allocator<int>_> *)0x0);
    aggreports::OutputMeanDamageRatio(agg,3,4,0x104588,(vector<int,_std::allocator<int>_> *)0x0);
  }
  aggreports::OutputFullUncertainty(agg,4,1,2,0x104582);
  aggreports::OutputFullUncertainty(agg,0,3,4,0x104588);
  local_28[0] = 5;
  local_28[1] = 7;
  __l._M_len = 2;
  __l._M_array = local_28;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_40,__l,&local_41);
  aggreports::OutputWheatsheafAndWheatsheafMean
            (agg,(vector<int,_std::allocator<int>_> *)&local_40,1,2,0x104582);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  local_28[0] = 1;
  local_28[1] = 3;
  __l_00._M_len = 2;
  __l_00._M_array = local_28;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_40,__l_00,&local_41);
  aggreports::OutputWheatsheafAndWheatsheafMean
            (agg,(vector<int,_std::allocator<int>_> *)&local_40,3,4,0x104588);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  aggreports::OutputSampleMean(agg,6,1,2,0x104582);
  aggreports::OutputSampleMean(agg,2,3,4,0x104588);
  return;
}

Assistant:

inline void outputaggreports(aggreports &agg,
		const std::set<int> &summaryids,
		std::vector<std::map<outkey2, OutLosses>> &out_loss,
		const int samplesize, const std::vector<int> &fileIDs_occ,
		const std::vector<int> &fileIDs_agg, const bool hasEPT)
	{
		agg.SetInputData(summaryids, out_loss);
		if (hasEPT) {
			agg.OutputMeanDamageRatio(OEP, OEPTVAR,
						  &OutLosses::GetMaxOutLoss,
						  fileIDs_occ);
			agg.OutputMeanDamageRatio(AEP, AEPTVAR,
						  &OutLosses::GetAggOutLoss,
						  fileIDs_agg);
		}
		agg.OutputFullUncertainty(OCC_FULL_UNCERTAINTY, OEP, OEPTVAR,
					  &OutLosses::GetMaxOutLoss);
		agg.OutputFullUncertainty(AGG_FULL_UNCERTAINTY, AEP, AEPTVAR,
					  &OutLosses::GetAggOutLoss);
		agg.OutputWheatsheafAndWheatsheafMean({ OCC_WHEATSHEAF,
							OCC_WHEATSHEAF_MEAN },
						      OEP, OEPTVAR,
						      &OutLosses::GetMaxOutLoss);
		agg.OutputWheatsheafAndWheatsheafMean({ AGG_WHEATSHEAF,
							AGG_WHEATSHEAF_MEAN },
						      AEP, AEPTVAR,
						      &OutLosses::GetAggOutLoss);
		agg.OutputSampleMean(OCC_SAMPLE_MEAN, OEP, OEPTVAR,
				     &OutLosses::GetMaxOutLoss);
		agg.OutputSampleMean(AGG_SAMPLE_MEAN, AEP, AEPTVAR,
				     &OutLosses::GetAggOutLoss);
	}